

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall AddrManImpl::SelectTriedCollision(AddrManImpl *this)

{
  long lVar1;
  char *in_RSI;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *ret;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  Mutex *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffcb;
  int in_stack_ffffffffffffffcc;
  AddrManImpl *in_stack_ffffffffffffffd0;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *mutexIn;
  AddrManImpl *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mutexIn = in_RDI;
  MaybeCheckNotHeld(in_stack_ffffffffffffffa8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffe8,
             (AnnotatedMixin<std::mutex> *)mutexIn,in_RSI,(char *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc,(bool)in_stack_ffffffffffffffcb);
  Check(in_stack_ffffffffffffffd0);
  SelectTriedCollision_(in_stack_ffffffffffffffe8);
  Check(in_stack_ffffffffffffffd0);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::SelectTriedCollision()
{
    LOCK(cs);
    Check();
    auto ret = SelectTriedCollision_();
    Check();
    return ret;
}